

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O2

void __thiscall
OPNMIDIplay::realTime_Controller(OPNMIDIplay *this,uint8_t channel,uint8_t type,uint8_t value)

{
  char cVar1;
  ulong uVar2;
  ushort uVar3;
  uint32_t sustain_type;
  ushort uVar4;
  undefined7 in_register_00000011;
  uint midCh;
  undefined7 in_register_00000031;
  pointer pMVar5;
  int iVar6;
  bool bVar7;
  uint uStack_20;
  
  pMVar5 = (this->m_midiChannels).
           super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)(channel & 0xf);
  if ((CONCAT71(in_register_00000031,channel) & 0xffffffff) <=
      (ulong)(((long)(this->m_midiChannels).
                     super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x140)) {
    uVar2 = CONCAT71(in_register_00000031,channel) & 0xffffffff;
  }
  iVar6 = (int)CONCAT71(in_register_00000011,type);
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
    pMVar5[uVar2 & 0xff].bank_msb = value;
    if ((this->m_synthMode & 1) != 0) {
      return;
    }
    pMVar5 = pMVar5 + (uVar2 & 0xff);
    bVar7 = SBORROW1(value,'~');
    cVar1 = value + 0x82;
LAB_00155677:
    pMVar5->is_xg_percussion = bVar7 == cVar1 < '\0';
    break;
  case 1:
    pMVar5[uVar2 & 0xff].vibrato = value;
    break;
  case 2:
  case 3:
  case 4:
  case 8:
  case 9:
    break;
  case 5:
    uVar4 = pMVar5[uVar2 & 0xff].portamento & 0x7f;
    uVar3 = (ushort)value << 7;
LAB_00155646:
    *(ushort *)((long)(pMVar5 + (uVar2 & 0xff)) + 0x14) = uVar3 | uVar4;
LAB_0015564d:
    updatePortamento(this,uVar2 & 0xff);
    return;
  case 6:
    bVar7 = true;
LAB_0015558f:
    setRPN(this,uVar2 & 0xff,(uint)value,bVar7);
    return;
  case 7:
    pMVar5[uVar2 & 0xff].volume = value;
    goto LAB_0015557d;
  case 10:
    pMVar5[uVar2 & 0xff].panning = value;
    uStack_20 = 2;
    goto LAB_0015561e;
  case 0xb:
    pMVar5[uVar2 & 0xff].expression = value;
LAB_0015557d:
    uStack_20 = 4;
LAB_0015561e:
    noteUpdateAll(this,uVar2 & 0xff,uStack_20);
    return;
  default:
    switch(iVar6) {
    case 0x40:
      midCh = (uint)(uVar2 & 0xff);
      pMVar5[uVar2 & 0xff].sustain = 0x3f < value;
      if (0x3f >= value) {
        sustain_type = 1;
        goto LAB_0015568f;
      }
      break;
    case 0x41:
      pMVar5[uVar2 & 0xff].portamentoEnable = 0x3f < value;
      goto LAB_0015564d;
    case 0x42:
      midCh = (uint)uVar2 & 0xff;
      if (0x3f < value) {
        markSostenutoNotes(this,midCh);
        return;
      }
      sustain_type = 2;
LAB_0015568f:
      killSustainingNotes(this,midCh,-1,sustain_type);
      return;
    case 0x43:
      pMVar5[uVar2 & 0xff].softPedal = 0x3f < value;
      break;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
      break;
    case 0x4a:
      pMVar5[uVar2 & 0xff].brightness = value;
      goto LAB_0015557d;
    default:
      switch(iVar6) {
      case 0x62:
        pMVar5[uVar2 & 0xff].lastlrpn = value;
        break;
      case 99:
        pMVar5[uVar2 & 0xff].lastmrpn = value;
        break;
      case 100:
        pMVar5[uVar2 & 0xff].lastlrpn = value;
        goto LAB_001555f1;
      case 0x65:
        pMVar5[uVar2 & 0xff].lastmrpn = value;
LAB_001555f1:
        *(char *)((long)(pMVar5 + (uVar2 & 0xff)) + 0xea) = '\0';
        return;
      default:
        if (iVar6 != 0x20) {
          if (iVar6 != 0x25) {
            if (iVar6 != 0x26) {
              if (iVar6 == 0x78) {
                uStack_20 = 0x60;
              }
              else {
                if (iVar6 == 0x79) {
                  uVar2 = uVar2 & 0xff;
                  midCh = (uint)uVar2;
                  MIDIchannel::resetAllControllers121(pMVar5 + uVar2);
                  noteUpdateAll(this,uVar2,0xe);
                  sustain_type = 3;
                  goto LAB_0015568f;
                }
                if (iVar6 != 0x7b) {
                  return;
                }
                uStack_20 = 0x20;
              }
              goto LAB_0015561e;
            }
            bVar7 = false;
            goto LAB_0015558f;
          }
          uVar4 = pMVar5[uVar2 & 0xff].portamento & 0x3f80;
          uVar3 = (ushort)value;
          goto LAB_00155646;
        }
        pMVar5[uVar2 & 0xff].bank_lsb = value;
        if ((this->m_synthMode & 1) != 0) {
          return;
        }
        pMVar5 = pMVar5 + (uVar2 & 0xff);
        bVar7 = SBORROW1(pMVar5->bank_msb,'~');
        cVar1 = pMVar5->bank_msb + 0x82;
        goto LAB_00155677;
      }
      *(char *)((long)(pMVar5 + (uVar2 & 0xff)) + 0xea) = '\x01';
    }
  }
  return;
}

Assistant:

void OPNMIDIplay::realTime_Controller(uint8_t channel, uint8_t type, uint8_t value)
{
    if(static_cast<size_t>(channel) > m_midiChannels.size())
        channel = channel % 16;
    switch(type)
    {
    case 1: // Adjust vibrato
        //UI.PrintLn("%u:vibrato %d", MidCh,value);
        m_midiChannels[channel].vibrato = value;
        break;

    case 0: // Set bank msb (GM bank)
        m_midiChannels[channel].bank_msb = value;
        if((m_synthMode & Mode_GS) == 0)// Don't use XG drums on GS synth mode
            m_midiChannels[channel].is_xg_percussion = isXgPercChannel(m_midiChannels[channel].bank_msb, m_midiChannels[channel].bank_lsb);
        break;

    case 32: // Set bank lsb (XG bank)
        m_midiChannels[channel].bank_lsb = value;
        if((m_synthMode & Mode_GS) == 0)// Don't use XG drums on GS synth mode
            m_midiChannels[channel].is_xg_percussion = isXgPercChannel(m_midiChannels[channel].bank_msb, m_midiChannels[channel].bank_lsb);
        break;

    case 5: // Set portamento msb
        m_midiChannels[channel].portamento = static_cast<uint16_t>((m_midiChannels[channel].portamento & 0x007F) | (value << 7));
        updatePortamento(channel);
        break;

    case 37: // Set portamento lsb
        m_midiChannels[channel].portamento = static_cast<uint16_t>((m_midiChannels[channel].portamento & 0x3F80) | (value));
        updatePortamento(channel);
        break;

    case 65: // Enable/disable portamento
        m_midiChannels[channel].portamentoEnable = value >= 64;
        updatePortamento(channel);
        break;

    case 7: // Change volume
        m_midiChannels[channel].volume = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 74: // Change brightness
        m_midiChannels[channel].brightness = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 64: // Enable/disable sustain
        m_midiChannels[channel].sustain = (value >= 64);
        if(!m_midiChannels[channel].sustain)
            killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_Pedal);
        break;

    case 66: // Enable/disable sostenuto
        if(value >= 64) //Find notes and mark them as sostenutoed
            markSostenutoNotes(channel);
        else
            killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_Sostenuto);
        break;

    case 67: // Enable/disable soft-pedal
        m_midiChannels[channel].softPedal = (value >= 64);
        break;

    case 11: // Change expression (another volume factor)
        m_midiChannels[channel].expression = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 10: // Change panning
        m_midiChannels[channel].panning = value;
        noteUpdateAll(channel, Upd_Pan);
        break;

    case 121: // Reset all controllers
        m_midiChannels[channel].resetAllControllers121();
        noteUpdateAll(channel, Upd_Pan + Upd_Volume + Upd_Pitch);
        // Kill all sustained notes
        killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_ANY);
        break;

    case 120: // All sounds off
        noteUpdateAll(channel, Upd_OffMute);
        break;

    case 123: // All notes off
        noteUpdateAll(channel, Upd_Off);
        break;

    case 91:
        break; // Reverb effect depth. We don't do per-channel reverb.

    case 92:
        break; // Tremolo effect depth. We don't do...

    case 93:
        break; // Chorus effect depth. We don't do.

    case 94:
        break; // Celeste effect depth. We don't do.

    case 95:
        break; // Phaser effect depth. We don't do.

    case 98:
        m_midiChannels[channel].lastlrpn = value;
        m_midiChannels[channel].nrpn = true;
        break;

    case 99:
        m_midiChannels[channel].lastmrpn = value;
        m_midiChannels[channel].nrpn = true;
        break;

    case 100:
        m_midiChannels[channel].lastlrpn = value;
        m_midiChannels[channel].nrpn = false;
        break;

    case 101:
        m_midiChannels[channel].lastmrpn = value;
        m_midiChannels[channel].nrpn = false;
        break;

    case 113:
        break; // Related to pitch-bender, used by missimp.mid in Duke3D

    case  6:
        setRPN(channel, value, true);
        break;

    case 38:
        setRPN(channel, value, false);
        break;

    //case 103:
    //    cmf_percussion_mode = (value != 0);
    //    break; // CMF (ctrl 0x67) rhythm mode

    default:
        break;
        //UI.PrintLn("Ctrl %d <- %d (ch %u)", ctrlno, value, MidCh);
    }
}